

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetTooltipV(char *fmt,__va_list_tag *args)

{
  ImGuiContext *g;
  
  if ((GImGui->DragDropWithinSourceOrTarget & 1U) == 0) {
    BeginTooltipEx(fmt._4_4_,fmt._3_1_);
  }
  else {
    BeginTooltip();
  }
  TextV(fmt,args);
  EndTooltip();
  return;
}

Assistant:

void ImGui::SetTooltipV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    if (g.DragDropWithinSourceOrTarget)
        BeginTooltip();
    else
        BeginTooltipEx(0, true);
    TextV(fmt, args);
    EndTooltip();
}